

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultCachedDocument.h
# Opt level: O2

void __thiscall
TgBot::InlineQueryResultCachedDocument::InlineQueryResultCachedDocument
          (InlineQueryResultCachedDocument *this)

{
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultCachedDocument_002cec98;
  (this->documentFileId)._M_dataplus._M_p = (pointer)&(this->documentFileId).field_2;
  (this->documentFileId)._M_string_length = 0;
  (this->documentFileId).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&(this->super_InlineQueryResult).type);
  return;
}

Assistant:

InlineQueryResultCachedDocument() {
        this->type = TYPE;
    }